

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O0

cram_file_def * cram_read_file_def(cram_fd *fd)

{
  ssize_t sVar1;
  cram_file_def *def;
  cram_fd *fd_local;
  
  fd_local = (cram_fd *)malloc(0x1a);
  if (fd_local == (cram_fd *)0x0) {
    fd_local = (cram_fd *)0x0;
  }
  else {
    sVar1 = hread(fd->fp,fd_local,0x1a);
    if (sVar1 == 0x1a) {
      if (*(int *)&fd_local->fp == 0x4d415243) {
        if (*(byte *)((long)&fd_local->fp + 4) < 4) {
          fd->first_container = fd->first_container + 0x1a;
          fd->last_slice = 0;
        }
        else {
          fprintf(_stderr,"CRAM version number mismatch\nExpected 1.x, 2.x or 3.x, got %d.%d\n",
                  (ulong)*(byte *)((long)&fd_local->fp + 4),
                  (ulong)*(byte *)((long)&fd_local->fp + 5));
          free(fd_local);
          fd_local = (cram_fd *)0x0;
        }
      }
      else {
        free(fd_local);
        fd_local = (cram_fd *)0x0;
      }
    }
    else {
      free(fd_local);
      fd_local = (cram_fd *)0x0;
    }
  }
  return (cram_file_def *)fd_local;
}

Assistant:

cram_file_def *cram_read_file_def(cram_fd *fd) {
    cram_file_def *def = malloc(sizeof(*def));
    if (!def)
	return NULL;

    if (26 != hread(fd->fp, &def->magic[0], 26)) {
	free(def);
	return NULL;
    }

    if (memcmp(def->magic, "CRAM", 4) != 0) {
	free(def);
	return NULL;
    }

    if (def->major_version > 3) {
	fprintf(stderr, "CRAM version number mismatch\n"
		"Expected 1.x, 2.x or 3.x, got %d.%d\n",
		def->major_version, def->minor_version);
	free(def);
	return NULL;
    }

    fd->first_container += 26;
    fd->last_slice = 0;

    return def;
}